

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[22],std::__cxx11::string,char[16],char[13],char[9],Diligent::MemorySizeFormatter<unsigned_long>,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [22],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs,
               char (*RestArgs_1) [16],char (*RestArgs_2) [13],char (*RestArgs_3) [9],
               MemorySizeFormatter<unsigned_long> *RestArgs_4,char (*RestArgs_5) [13],
               uint *RestArgs_6,char (*RestArgs_7) [28],
               MemorySizeFormatter<unsigned_long> *RestArgs_8)

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(ss + 0x10),(RestArgs->_M_dataplus)._M_p,RestArgs->_M_string_length);
  FormatStrSS<std::__cxx11::stringstream,char[16],char[13],char[9],Diligent::MemorySizeFormatter<unsigned_long>,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,RestArgs_7,
             RestArgs_8);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}